

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerExclusiveLock(Pager *pPager)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  
  iVar2 = pagerLockDb(pPager,4);
  if (iVar2 != 0) {
    psVar1 = pPager->fd->pMethods;
    if (psVar1 != (sqlite3_io_methods *)0x0) {
      if (pPager->noLock == '\0') {
        (*psVar1->xUnlock)(pPager->fd,1);
      }
      if (pPager->eLock != '\x05') {
        pPager->eLock = '\x01';
      }
    }
    pPager->changeCountDone = pPager->tempFile;
  }
  return iVar2;
}

Assistant:

static int pagerExclusiveLock(Pager *pPager){
  int rc;                         /* Return code */

  assert( pPager->eLock==SHARED_LOCK || pPager->eLock==EXCLUSIVE_LOCK );
  rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
  if( rc!=SQLITE_OK ){
    /* If the attempt to grab the exclusive lock failed, release the
    ** pending lock that may have been obtained instead.  */
    pagerUnlockDb(pPager, SHARED_LOCK);
  }

  return rc;
}